

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

int co_cond_broadcast(stCoCond_t *si)

{
  stCoCondItem_t *psVar1;
  stCoRoutineEnv_t *psVar2;
  stCoCondItem_t *sp;
  stCoCond_t *si_local;
  
  while( true ) {
    psVar1 = co_cond_pop(si);
    if (psVar1 == (stCoCondItem_t *)0x0) break;
    RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(&psVar1->timeout);
    psVar2 = co_get_curr_thread_env();
    AddTail<stTimeoutItem_t,stTimeoutItemLink_t>(psVar2->pEpoll->pstActiveList,&psVar1->timeout);
  }
  return 0;
}

Assistant:

int co_cond_broadcast( stCoCond_t *si )
{
	for(;;)
	{
		stCoCondItem_t * sp = co_cond_pop( si );
		if( !sp ) return 0;

		RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( &sp->timeout );

		AddTail( co_get_curr_thread_env()->pEpoll->pstActiveList,&sp->timeout );
	}

	return 0;
}